

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

string_t duckdb::DatePart::PartOperator<duckdb::DayNameOperator>::
         Operation<duckdb::timestamp_t,duckdb::string_t>
                   (timestamp_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  timestamp_t in_RDI;
  timestamp_t in_stack_ffffffffffffffb8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffc0;
  anon_union_16_2_67f50693_for_value local_10;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(in_RDI);
  if (bVar1) {
    local_10.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         DayNameOperator::Operation<duckdb::timestamp_t,duckdb::string_t>(in_stack_ffffffffffffffb8)
    ;
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8.value);
    memset(&local_10,0,0x10);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static inline TR Operation(TA input, ValidityMask &mask, idx_t idx, void *dataptr) {
			if (Value::IsFinite(input)) {
				return OP::template Operation<TA, TR>(input);
			} else {
				mask.SetInvalid(idx);
				return TR();
			}
		}